

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exponentiation.cc
# Opt level: O0

int BN_mod_exp(BIGNUM *r,BIGNUM *a,BIGNUM *p,BIGNUM *m,BN_CTX *ctx)

{
  int iVar1;
  BN_CTX *ctx_local;
  BIGNUM *m_local;
  BIGNUM *p_local;
  BIGNUM *a_local;
  BIGNUM *r_local;
  
  if (m->neg == 0) {
    if (((a->neg == 0) && (iVar1 = BN_ucmp(a,m), p_local = (BIGNUM *)a, iVar1 < 0)) ||
       (iVar1 = BN_nnmod(r,a,m,ctx), p_local = (BIGNUM *)r, iVar1 != 0)) {
      iVar1 = BN_is_odd((BIGNUM *)m);
      if (iVar1 == 0) {
        r_local._4_4_ = mod_exp_even((BIGNUM *)r,p_local,(BIGNUM *)p,(BIGNUM *)m,(BN_CTX *)ctx);
      }
      else {
        r_local._4_4_ =
             BN_mod_exp_mont((BIGNUM *)r,p_local,(BIGNUM *)p,(BIGNUM *)m,(BN_CTX *)ctx,
                             (BN_MONT_CTX *)0x0);
      }
    }
    else {
      r_local._4_4_ = 0;
    }
  }
  else {
    ERR_put_error(3,0,0x6d,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/exponentiation.cc"
                  ,0x6a);
    r_local._4_4_ = 0;
  }
  return r_local._4_4_;
}

Assistant:

int BN_mod_exp(BIGNUM *r, const BIGNUM *a, const BIGNUM *p, const BIGNUM *m,
               BN_CTX *ctx) {
  if (m->neg) {
    OPENSSL_PUT_ERROR(BN, BN_R_NEGATIVE_NUMBER);
    return 0;
  }
  if (a->neg || BN_ucmp(a, m) >= 0) {
    if (!BN_nnmod(r, a, m, ctx)) {
      return 0;
    }
    a = r;
  }

  if (BN_is_odd(m)) {
    return BN_mod_exp_mont(r, a, p, m, ctx, NULL);
  }

  return mod_exp_even(r, a, p, m, ctx);
}